

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec2<short>_>::extendBy
          (Box<Imath_2_5::Vec2<short>_> *this,Vec2<short> *point)

{
  short sVar1;
  short *psVar2;
  Vec2<short> *in_RSI;
  Vec2<short> *in_RDI;
  
  psVar2 = Vec2<short>::operator[](in_RSI,0);
  sVar1 = *psVar2;
  psVar2 = Vec2<short>::operator[](in_RDI,0);
  if (sVar1 < *psVar2) {
    psVar2 = Vec2<short>::operator[](in_RSI,0);
    sVar1 = *psVar2;
    psVar2 = Vec2<short>::operator[](in_RDI,0);
    *psVar2 = sVar1;
  }
  psVar2 = Vec2<short>::operator[](in_RSI,0);
  sVar1 = *psVar2;
  psVar2 = Vec2<short>::operator[](in_RDI + 1,0);
  if (*psVar2 < sVar1) {
    psVar2 = Vec2<short>::operator[](in_RSI,0);
    sVar1 = *psVar2;
    psVar2 = Vec2<short>::operator[](in_RDI + 1,0);
    *psVar2 = sVar1;
  }
  psVar2 = Vec2<short>::operator[](in_RSI,1);
  sVar1 = *psVar2;
  psVar2 = Vec2<short>::operator[](in_RDI,1);
  if (sVar1 < *psVar2) {
    psVar2 = Vec2<short>::operator[](in_RSI,1);
    sVar1 = *psVar2;
    psVar2 = Vec2<short>::operator[](in_RDI,1);
    *psVar2 = sVar1;
  }
  psVar2 = Vec2<short>::operator[](in_RSI,1);
  sVar1 = *psVar2;
  psVar2 = Vec2<short>::operator[](in_RDI + 1,1);
  if (*psVar2 < sVar1) {
    psVar2 = Vec2<short>::operator[](in_RSI,1);
    sVar1 = *psVar2;
    psVar2 = Vec2<short>::operator[](in_RDI + 1,1);
    *psVar2 = sVar1;
  }
  return;
}

Assistant:

inline void
Box<Vec2<T> >::extendBy (const Vec2<T> &point)
{
    if (point[0] < min[0])
        min[0] = point[0];

    if (point[0] > max[0])
        max[0] = point[0];

    if (point[1] < min[1])
        min[1] = point[1];

    if (point[1] > max[1])
        max[1] = point[1];
}